

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_prefix_coding.cpp
# Opt level: O1

bool crnlib::prefix_coding::generate_decoder_tables
               (uint num_syms,uint8 *pCodesizes,decoder_tables *pTables,uint table_bits)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  ushort uVar4;
  uint uVar5;
  uint16 *puVar6;
  uint32 *puVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  uint i;
  uint uVar11;
  void *pvVar12;
  uint *puVar13;
  byte bVar14;
  byte bVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  uint num_codes [17];
  uint min_codes [16];
  uint sorted_positions [17];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  uint auStack_bc [35];
  
  bVar10 = table_bits < 0xc && num_syms != 0;
  if (table_bits >= 0xc || num_syms == 0) {
    return bVar10;
  }
  pTables->m_num_syms = num_syms;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_c8 = 0;
  uVar16 = 0;
  do {
    if ((ulong)pCodesizes[uVar16] != 0) {
      *(int *)(local_108 + (ulong)pCodesizes[uVar16] * 4) =
           *(int *)(local_108 + (ulong)pCodesizes[uVar16] * 4) + 1;
    }
    uVar16 = uVar16 + 1;
  } while (num_syms != uVar16);
  uVar11 = 0xffffffff;
  lVar17 = 0;
  bVar14 = 0xf;
  uVar19 = 0;
  uVar21 = 0;
  uVar24 = 0;
  do {
    iVar23 = *(int *)(local_108 + lVar17 * 4 + 4);
    if (iVar23 == 0) {
      pTables->m_max_codes[lVar17] = 0;
    }
    else {
      uVar22 = (int)lVar17 + 1;
      if (uVar22 <= uVar11) {
        uVar11 = uVar22;
      }
      if (uVar24 <= uVar22) {
        uVar24 = uVar22;
      }
      iVar1 = iVar23 + uVar19;
      auStack_bc[lVar17 + 1] = uVar19;
      uVar19 = uVar19 + iVar23;
      pTables->m_max_codes[lVar17] = (~(-1 << (bVar14 & 0x1f)) | iVar1 + -1 << (bVar14 & 0x1f)) + 1;
      pTables->m_val_ptrs[lVar17] = uVar21;
      auStack_bc[lVar17 + 0x12] = uVar21;
      uVar21 = iVar23 + uVar21;
    }
    uVar19 = uVar19 * 2;
    bVar14 = bVar14 - 1;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 0x10);
  pTables->m_total_used_syms = uVar21;
  if (pTables->m_cur_sorted_symbol_order_size < uVar21) {
    uVar19 = uVar21 - 1;
    if (((uVar21 & uVar19) != 0) &&
       (uVar19 = uVar19 >> 0x10 | uVar19, uVar19 = uVar19 >> 8 | uVar19,
       uVar19 = uVar19 >> 4 | uVar19, uVar19 = uVar19 >> 2 | uVar19,
       uVar21 = (uVar19 >> 1 | uVar19) + 1, num_syms < uVar21)) {
      uVar21 = num_syms;
    }
    pTables->m_cur_sorted_symbol_order_size = uVar21;
    puVar6 = pTables->m_sorted_symbol_order;
    if (puVar6 != (uint16 *)0x0) {
      if ((*(uint *)(puVar6 + -4) ^ *(uint *)(puVar6 + -2)) == 0xffffffff) {
        crnlib_free(puVar6 + -8);
      }
      pTables->m_sorted_symbol_order = (uint16 *)0x0;
    }
    uVar19 = pTables->m_cur_sorted_symbol_order_size +
             (uint)(pTables->m_cur_sorted_symbol_order_size == 0);
    pvVar12 = crnlib_malloc((ulong)uVar19 * 2 + 0x10);
    *(uint *)((long)pvVar12 + 0xc) = uVar19;
    *(uint *)((long)pvVar12 + 8) = ~uVar19;
    pTables->m_sorted_symbol_order = (uint16 *)((long)pvVar12 + 0x10);
  }
  pTables->m_min_code_size = (uint8)uVar11;
  pTables->m_max_code_size = (uint8)uVar24;
  uVar16 = 0;
  do {
    uVar20 = (ulong)pCodesizes[uVar16];
    if (uVar20 != 0) {
      uVar19 = auStack_bc[uVar20 + 0x11];
      auStack_bc[uVar20 + 0x11] = uVar19 + 1;
      pTables->m_sorted_symbol_order[uVar19] = (uint16)uVar16;
    }
    uVar16 = uVar16 + 1;
  } while (num_syms + (num_syms == 0) != uVar16);
  uVar16 = 0;
  uVar19 = (uint)pTables->m_min_code_size;
  if (uVar19 < table_bits) {
    uVar16 = (ulong)table_bits;
  }
  uVar11 = (uint)uVar16;
  pTables->m_table_bits = uVar11;
  if (uVar19 < table_bits) {
    bVar14 = (byte)uVar16;
    uVar21 = 1 << (bVar14 & 0x1f);
    if (pTables->m_cur_lookup_size < uVar21) {
      pTables->m_cur_lookup_size = uVar21;
      puVar7 = pTables->m_lookup;
      if (puVar7 != (uint32 *)0x0) {
        if ((puVar7[-2] ^ puVar7[-1]) == 0xffffffff) {
          crnlib_free(puVar7 + -4);
        }
        pTables->m_lookup = (uint32 *)0x0;
      }
      pvVar12 = crnlib_malloc((ulong)((4 << (bVar14 & 0x1f)) + 0x10));
      *(uint *)((long)pvVar12 + 0xc) = uVar21;
      *(uint *)((long)pvVar12 + 8) = ~uVar21;
      pTables->m_lookup = (uint32 *)((long)pvVar12 + 0x10);
    }
    memset(pTables->m_lookup,0xff,4L << (bVar14 & 0x3f));
    if (uVar19 < table_bits) {
      uVar20 = 1;
      do {
        if (*(int *)(local_108 + uVar20 * 4) != 0) {
          uVar5 = pTables->m_max_codes[uVar20 - 1];
          uVar22 = uVar5 - 1 >> (0x10U - (char)uVar20 & 0x1f);
          uVar21 = auStack_bc[uVar20];
          if ((uVar5 == 0) || (uVar21 <= uVar22)) {
            bVar15 = bVar14 - (char)uVar20;
            iVar23 = pTables->m_max_codes[uVar20 + 0x10] - uVar21;
            do {
              uVar4 = pTables->m_sorted_symbol_order[iVar23 + uVar21];
              uVar18 = 1;
              do {
                pTables->m_lookup[((uVar21 << (bVar15 & 0x1f)) + uVar18) - 1] =
                     (uint)uVar4 | (int)uVar20 << 0x10;
                uVar8 = uVar18 >> (bVar15 & 0x1f);
                uVar18 = uVar18 + 1;
              } while (uVar8 == 0);
              uVar21 = uVar21 + 1;
            } while ((uVar5 == 0) || (uVar21 <= uVar22));
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar11 + 1 + (uint)(uVar11 == 0));
    }
  }
  lVar17 = 0;
  do {
    piVar2 = pTables->m_val_ptrs + lVar17;
    iVar23 = piVar2[1];
    iVar1 = piVar2[2];
    iVar9 = piVar2[3];
    uVar21 = auStack_bc[lVar17 + 2];
    uVar22 = auStack_bc[lVar17 + 3];
    uVar18 = auStack_bc[lVar17 + 4];
    piVar3 = pTables->m_val_ptrs + lVar17;
    *piVar3 = *piVar2 - auStack_bc[lVar17 + 1];
    piVar3[1] = iVar23 - uVar21;
    piVar3[2] = iVar1 - uVar22;
    piVar3[3] = iVar9 - uVar18;
    lVar17 = lVar17 + 4;
  } while (lVar17 != 0x10);
  pTables->m_table_max_code = 0;
  pTables->m_decode_start_code_size = (uint)pTables->m_min_code_size;
  if (uVar19 < table_bits) {
    puVar13 = pTables->m_max_codes + (uVar11 - 1);
    do {
      if (*(int *)(local_108 + uVar16 * 4) != 0) {
        pTables->m_table_max_code = *puVar13;
        uVar19 = uVar11 + 1;
        pTables->m_decode_start_code_size = uVar19;
        if (uVar11 < uVar24) goto LAB_001af197;
        break;
      }
      puVar13 = puVar13 + -1;
      uVar19 = (int)uVar16 - 1;
      uVar16 = (ulong)uVar19;
    } while (uVar19 != 0);
  }
  goto LAB_001af1ac;
  while (uVar19 = uVar19 + 1, uVar19 <= uVar24) {
LAB_001af197:
    if (*(int *)(local_108 + (ulong)uVar19 * 4) != 0) {
      pTables->m_decode_start_code_size = uVar19;
      break;
    }
  }
LAB_001af1ac:
  pTables->m_max_codes[0x10] = 0xffffffff;
  pTables->m_val_ptrs[0x10] = 0xfffff;
  pTables->m_table_shift = 0x20 - pTables->m_table_bits;
  return bVar10;
}

Assistant:

bool generate_decoder_tables(uint num_syms, const uint8* pCodesizes, decoder_tables* pTables, uint table_bits) {
  uint min_codes[cMaxExpectedCodeSize];

  if ((!num_syms) || (table_bits > cMaxTableBits))
    return false;

  pTables->m_num_syms = num_syms;

  uint num_codes[cMaxExpectedCodeSize + 1];
  utils::zero_object(num_codes);

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c)
      num_codes[c]++;
  }

  uint sorted_positions[cMaxExpectedCodeSize + 1];

  uint code = 0;

  uint total_used_syms = 0;
  uint max_code_size = 0;
  uint min_code_size = UINT_MAX;
  for (uint i = 1; i <= cMaxExpectedCodeSize; i++) {
    const uint n = num_codes[i];

    if (!n)
      pTables->m_max_codes[i - 1] = 0;  //UINT_MAX;
    else {
      min_code_size = math::minimum(min_code_size, i);
      max_code_size = math::maximum(max_code_size, i);

      min_codes[i - 1] = code;

      pTables->m_max_codes[i - 1] = code + n - 1;
      pTables->m_max_codes[i - 1] = 1 + ((pTables->m_max_codes[i - 1] << (16 - i)) | ((1 << (16 - i)) - 1));

      pTables->m_val_ptrs[i - 1] = total_used_syms;

      sorted_positions[i] = total_used_syms;

      code += n;
      total_used_syms += n;
    }

    code <<= 1;
  }

  pTables->m_total_used_syms = total_used_syms;

  if (total_used_syms > pTables->m_cur_sorted_symbol_order_size) {
    pTables->m_cur_sorted_symbol_order_size = total_used_syms;

    if (!math::is_power_of_2(total_used_syms))
      pTables->m_cur_sorted_symbol_order_size = math::minimum<uint>(num_syms, math::next_pow2(total_used_syms));

    if (pTables->m_sorted_symbol_order) {
      crnlib_delete_array(pTables->m_sorted_symbol_order);
      pTables->m_sorted_symbol_order = NULL;
    }

    pTables->m_sorted_symbol_order = crnlib_new_array<uint16>(pTables->m_cur_sorted_symbol_order_size);
  }

  pTables->m_min_code_size = static_cast<uint8>(min_code_size);
  pTables->m_max_code_size = static_cast<uint8>(max_code_size);

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c) {
      CRNLIB_ASSERT(num_codes[c]);

      uint sorted_pos = sorted_positions[c]++;

      CRNLIB_ASSERT(sorted_pos < total_used_syms);

      pTables->m_sorted_symbol_order[sorted_pos] = static_cast<uint16>(i);
    }
  }

  if (table_bits <= pTables->m_min_code_size)
    table_bits = 0;
  pTables->m_table_bits = table_bits;

  if (table_bits) {
    uint table_size = 1 << table_bits;
    if (table_size > pTables->m_cur_lookup_size) {
      pTables->m_cur_lookup_size = table_size;

      if (pTables->m_lookup) {
        crnlib_delete_array(pTables->m_lookup);
        pTables->m_lookup = NULL;
      }

      pTables->m_lookup = crnlib_new_array<uint32>(table_size);
    }

    memset(pTables->m_lookup, 0xFF, static_cast<uint>(sizeof(pTables->m_lookup[0])) * (1UL << table_bits));

    for (uint codesize = 1; codesize <= table_bits; codesize++) {
      if (!num_codes[codesize])
        continue;

      const uint fillsize = table_bits - codesize;
      const uint fillnum = 1 << fillsize;

      const uint min_code = min_codes[codesize - 1];
      const uint max_code = pTables->get_unshifted_max_code(codesize);
      const uint val_ptr = pTables->m_val_ptrs[codesize - 1];

      for (uint code = min_code; code <= max_code; code++) {
        const uint sym_index = pTables->m_sorted_symbol_order[val_ptr + code - min_code];
        CRNLIB_ASSERT(pCodesizes[sym_index] == codesize);

        for (uint j = 0; j < fillnum; j++) {
          const uint t = j + (code << fillsize);

          CRNLIB_ASSERT(t < (1U << table_bits));

          CRNLIB_ASSERT(pTables->m_lookup[t] == cUINT32_MAX);

          pTables->m_lookup[t] = sym_index | (codesize << 16U);
        }
      }
    }
  }

  for (uint i = 0; i < cMaxExpectedCodeSize; i++)
    pTables->m_val_ptrs[i] -= min_codes[i];

  pTables->m_table_max_code = 0;
  pTables->m_decode_start_code_size = pTables->m_min_code_size;

  if (table_bits) {
    uint i;
    for (i = table_bits; i >= 1; i--) {
      if (num_codes[i]) {
        pTables->m_table_max_code = pTables->m_max_codes[i - 1];
        break;
      }
    }
    if (i >= 1) {
      pTables->m_decode_start_code_size = table_bits + 1;
      for (uint i = table_bits + 1; i <= max_code_size; i++) {
        if (num_codes[i]) {
          pTables->m_decode_start_code_size = i;
          break;
        }
      }
    }
  }

  // sentinels
  pTables->m_max_codes[cMaxExpectedCodeSize] = UINT_MAX;
  pTables->m_val_ptrs[cMaxExpectedCodeSize] = 0xFFFFF;

  pTables->m_table_shift = 32 - pTables->m_table_bits;

  return true;
}